

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Parameters PVar1;
  Incppect<true> *pIVar2;
  long *plVar3;
  char *__s;
  long lVar4;
  int8_t var_int8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  int16_t var_int16;
  float var_float;
  int32_t var_int32;
  char *var_str;
  double var_double;
  int32_t var_arr32 [4];
  string httpRoot;
  undefined1 in_stack_fffffffffffffde8 [15];
  undefined1 in_stack_fffffffffffffdf7;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  code *pcVar5;
  undefined8 in_stack_fffffffffffffe10;
  duration<long,_std::ratio<1L,_1000L>_> dVar6;
  undefined8 in_stack_fffffffffffffe20;
  long in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  long *plVar7;
  undefined1 in_stack_fffffffffffffe40 [30];
  undefined2 in_stack_fffffffffffffe5e;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  undefined1 local_170 [24];
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  pointer local_138;
  pointer pbStack_130;
  pointer local_128;
  _Alloc_hider local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  _Alloc_hider local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  long local_e0;
  long local_d8;
  Parameters local_c0;
  
  printf("Usage: %s [port] [httpRoot]\n",*argv);
  if (argc < 2) {
    __s = "../examples";
    local_170._0_4_ = 3000;
  }
  else {
    local_170._0_4_ = atoi(argv[1]);
    if (argc == 2) {
      __s = "../examples";
    }
    else {
      __s = argv[2];
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,__s,(allocator<char> *)local_170);
  local_170._8_8_ = 3000;
  local_170._16_4_ = 0x78;
  local_158._M_p = (pointer)&local_148;
  local_148._M_allocated_capacity._0_2_ = 0x2e;
  local_150 = 1;
  local_138 = (pointer)0x0;
  pbStack_130 = (pointer)0x0;
  local_128 = (pointer)0x0;
  local_120._M_p = (pointer)&local_110;
  local_110._M_allocated_capacity._0_4_ = 0x2e79656b;
  local_110._M_allocated_capacity._4_3_ = 0x6d6570;
  local_118 = 7;
  local_110._M_local_buf[7] = '\0';
  local_100._M_p = (pointer)&local_f0;
  local_f0._M_allocated_capacity = 0x6d65702e74726563;
  local_f8 = 8;
  local_f0._M_local_buf[8] = '\0';
  local_170._4_4_ = 0x40000;
  dVar6.__r = (rep)&stack0xfffffffffffffe28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffe18,local_e0,local_d8 + local_e0);
  std::__cxx11::string::append(&stack0xfffffffffffffe18);
  std::__cxx11::string::operator=((string *)&local_158,(string *)&stack0xfffffffffffffe18);
  if ((undefined1 *)dVar6.__r != &stack0xfffffffffffffe28) {
    operator_delete((void *)dVar6.__r,in_stack_fffffffffffffe28 + 1);
  }
  dVar6.__r = (rep)&stack0xfffffffffffffe28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe18,"");
  plVar3 = (long *)&stack0xfffffffffffffe48;
  plVar7 = plVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe38,"index.html","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
             &stack0xfffffffffffffe18,&stack0xfffffffffffffe58);
  lVar4 = -0x40;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  std::__cxx11::string::operator=((string *)&local_120,"key.pem");
  std::__cxx11::string::operator=((string *)&local_100,"cert.pem");
  Incppect<true>::getInstance();
  Incppect<true>::Parameters::Parameters(&local_c0,(Parameters *)local_170);
  PVar1.tLastRequestTimeout_ms._7_1_ = in_stack_fffffffffffffdf7;
  PVar1._0_15_ = in_stack_fffffffffffffde8;
  PVar1._16_8_ = in_stack_fffffffffffffdf8;
  PVar1.httpRoot._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe00;
  PVar1.httpRoot._M_string_length = in_stack_fffffffffffffe08;
  PVar1.httpRoot.field_2._M_allocated_capacity = in_stack_fffffffffffffe10;
  PVar1.httpRoot.field_2._8_8_ = dVar6.__r;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe20;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe28;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe30;
  PVar1.sslKey._M_dataplus._M_p = (pointer)plVar7;
  PVar1._88_30_ = in_stack_fffffffffffffe40;
  PVar1.sslCert._M_dataplus._M_p._6_2_ = in_stack_fffffffffffffe5e;
  PVar1.sslCert._M_string_length._0_4_ = in_stack_fffffffffffffe60;
  PVar1.sslCert._M_string_length._4_4_ = in_stack_fffffffffffffe64;
  PVar1.sslCert.field_2._M_allocated_capacity = in_stack_fffffffffffffe68;
  PVar1.sslCert.field_2._8_8_ = in_stack_fffffffffffffe70;
  Incppect<true>::runAsync(PVar1);
  std::thread::detach();
  if ((undefined1 *)dVar6.__r == (undefined1 *)0x0) {
    Incppect<true>::Parameters::~Parameters(&local_c0);
    pIVar2 = Incppect<true>::getInstance();
    dVar6.__r = (rep)&stack0xfffffffffffffe28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe18,"var_int8","");
    pcVar5 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:38:45)>
             ::_M_manager;
    Incppect<true>::var((string *)pIVar2,(function *)&stack0xfffffffffffffe18);
    if (pcVar5 != (code *)0x0) {
      (*pcVar5)(&stack0xfffffffffffffdf8,&stack0xfffffffffffffdf8,3);
    }
    if ((undefined1 *)dVar6.__r != &stack0xfffffffffffffe28) {
      operator_delete((void *)dVar6.__r,in_stack_fffffffffffffe28 + 1);
    }
    pIVar2 = Incppect<true>::getInstance();
    dVar6.__r = (rep)&stack0xfffffffffffffe28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe18,"var_int16","");
    pcVar5 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:39:46)>
             ::_M_manager;
    Incppect<true>::var((string *)pIVar2,(function *)&stack0xfffffffffffffe18);
    if (pcVar5 != (code *)0x0) {
      (*pcVar5)(&stack0xfffffffffffffdf8,&stack0xfffffffffffffdf8,3);
    }
    if ((undefined1 *)dVar6.__r != &stack0xfffffffffffffe28) {
      operator_delete((void *)dVar6.__r,in_stack_fffffffffffffe28 + 1);
    }
    pIVar2 = Incppect<true>::getInstance();
    dVar6.__r = (rep)&stack0xfffffffffffffe28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe18,"var_int32","");
    pcVar5 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:40:46)>
             ::_M_manager;
    Incppect<true>::var((string *)pIVar2,(function *)&stack0xfffffffffffffe18);
    if (pcVar5 != (code *)0x0) {
      (*pcVar5)(&stack0xfffffffffffffdf8,&stack0xfffffffffffffdf8,3);
    }
    if ((undefined1 *)dVar6.__r != &stack0xfffffffffffffe28) {
      operator_delete((void *)dVar6.__r,in_stack_fffffffffffffe28 + 1);
    }
    pIVar2 = Incppect<true>::getInstance();
    dVar6.__r = (rep)&stack0xfffffffffffffe28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe18,"var_int32_arr","");
    pcVar5 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:41:50)>
             ::_M_manager;
    Incppect<true>::var((string *)pIVar2,(function *)&stack0xfffffffffffffe18);
    if (pcVar5 != (code *)0x0) {
      (*pcVar5)(&stack0xfffffffffffffdf8,&stack0xfffffffffffffdf8,3);
    }
    if ((undefined1 *)dVar6.__r != &stack0xfffffffffffffe28) {
      operator_delete((void *)dVar6.__r,in_stack_fffffffffffffe28 + 1);
    }
    pIVar2 = Incppect<true>::getInstance();
    dVar6.__r = (rep)&stack0xfffffffffffffe28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe18,"var_int32_arr[%d]","");
    pcVar5 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:42:54)>
             ::_M_manager;
    Incppect<true>::var((string *)pIVar2,(function *)&stack0xfffffffffffffe18);
    if (pcVar5 != (code *)0x0) {
      (*pcVar5)(&stack0xfffffffffffffdf8,&stack0xfffffffffffffdf8,3);
    }
    if ((undefined1 *)dVar6.__r != &stack0xfffffffffffffe28) {
      operator_delete((void *)dVar6.__r,in_stack_fffffffffffffe28 + 1);
    }
    pIVar2 = Incppect<true>::getInstance();
    dVar6.__r = (rep)&stack0xfffffffffffffe28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe18,"var_float","");
    pcVar5 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:43:46)>
             ::_M_manager;
    Incppect<true>::var((string *)pIVar2,(function *)&stack0xfffffffffffffe18);
    if (pcVar5 != (code *)0x0) {
      (*pcVar5)(&stack0xfffffffffffffdf8,&stack0xfffffffffffffdf8,3);
    }
    if ((undefined1 *)dVar6.__r != &stack0xfffffffffffffe28) {
      operator_delete((void *)dVar6.__r,in_stack_fffffffffffffe28 + 1);
    }
    pIVar2 = Incppect<true>::getInstance();
    dVar6.__r = (rep)&stack0xfffffffffffffe28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe18,"var_double","");
    pcVar5 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:44:47)>
             ::_M_manager;
    Incppect<true>::var((string *)pIVar2,(function *)&stack0xfffffffffffffe18);
    if (pcVar5 != (code *)0x0) {
      (*pcVar5)(&stack0xfffffffffffffdf8,&stack0xfffffffffffffdf8,3);
    }
    if ((undefined1 *)dVar6.__r != &stack0xfffffffffffffe28) {
      operator_delete((void *)dVar6.__r,in_stack_fffffffffffffe28 + 1);
    }
    pIVar2 = Incppect<true>::getInstance();
    dVar6.__r = (rep)&stack0xfffffffffffffe28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe18,"var_str","")
    ;
    pcVar5 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:45:44)>
             ::_M_manager;
    Incppect<true>::var((string *)pIVar2,(function *)&stack0xfffffffffffffe18);
    if (pcVar5 != (code *)0x0) {
      (*pcVar5)(&stack0xfffffffffffffdf8,&stack0xfffffffffffffdf8,3);
    }
    if ((undefined1 *)dVar6.__r != &stack0xfffffffffffffe28) {
      operator_delete((void *)dVar6.__r,in_stack_fffffffffffffe28 + 1);
    }
    do {
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&stack0xfffffffffffffe18);
    } while( true );
  }
  std::terminate();
}

Assistant:

int main(int argc, char ** argv) {
	printf("Usage: %s [port] [httpRoot]\n", argv[0]);

    int port = argc > 1 ? atoi(argv[1]) : 3000;
    std::string httpRoot = argc > 2 ? argv[2] : "../examples";

    incppect::Parameters parameters;
    parameters.portListen = port;
    parameters.maxPayloadLength_bytes = 256*1024;
    parameters.httpRoot = httpRoot + "/hello-browser-ssl";
    parameters.resources = { "", "index.html", };

    // make sure you have generated those and they are valid
    parameters.sslKey = "key.pem";
    parameters.sslCert = "cert.pem";

    incppect::getInstance().runAsync(parameters).detach();

    int8_t  var_int8  = 1;
    int16_t var_int16 = 2;
    int32_t var_int32 = 3;
    int32_t var_arr32[4] = { 4, 5, 6, 7 };
    float   var_float = 8.0f;
    double  var_double = 16.0f;

    const char * var_str = "hello browser over SSL";

    incppect::getInstance().var("var_int8", [&](auto) { return incppect::view(var_int8); });
    incppect::getInstance().var("var_int16", [&](auto) { return incppect::view(var_int16); });
    incppect::getInstance().var("var_int32", [&](auto) { return incppect::view(var_int32); });
    incppect::getInstance().var("var_int32_arr", [&](auto) { return incppect::view(var_arr32); });
    incppect::getInstance().var("var_int32_arr[%d]", [&](auto idxs) { return incppect::view(var_arr32[idxs[0]]); });
    incppect::getInstance().var("var_float", [&](auto idxs) { return incppect::view(var_float); });
    incppect::getInstance().var("var_double", [&](auto idxs) { return incppect::view(var_double); });
    incppect::getInstance().var("var_str", [&](auto idxs) { return var_str; });

    while (true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(1));
    }

    return 0;
}